

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_sls_8_al(void)

{
  uint uVar1;
  uint addr_in;
  uint uVar2;
  uint value;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar2 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  addr_in = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  uVar1 = m68ki_cpu.c_flag;
  uVar2 = m68ki_cpu.not_z_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  value = 0;
  if (uVar2 == 0) {
    value = 0xff;
  }
  if ((uVar1 & 0x100) != 0) {
    value = 0xff;
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,value);
  return;
}

Assistant:

static void m68k_op_sls_8_al(void)
{
	m68ki_write_8(EA_AL_8(), COND_LS() ? 0xff : 0);
}